

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O0

StepStatus __thiscall
adios2::core::engine::SstReader::BeginStep(SstReader *this,StepMode Mode,float timeout_sec)

{
  size_t *psVar1;
  int iVar2;
  int iVar3;
  BP5Deserializer *this_00;
  size_t WriterCount;
  SstMetaMetaList __ptr;
  IO *this_01;
  string *psVar4;
  SstFullMetadata p_Var5;
  void *pvVar6;
  char *__dest;
  uint in_ESI;
  size_t in_RDI;
  bool bVar7;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  size_t in_stack_00000010;
  void *in_stack_00000018;
  BP5Deserializer *in_stack_00000020;
  ScopedTimer __var2379;
  _SstData *tmp;
  int i_1;
  SstBlock AttributeBlockList;
  MetaMetaInfoBlock MM;
  int i;
  SstMetaMetaList MMList;
  SstStatusValue result;
  ScopedTimer __var2293;
  string *in_stack_000009b8;
  string *in_stack_000009c0;
  Params *in_stack_000009c8;
  BPBase *in_stack_000009d0;
  void *in_stack_fffffffffffffc38;
  SstStream in_stack_fffffffffffffc40;
  MetaMetaInfoBlock *in_stack_fffffffffffffc48;
  BP3Deserializer *in_stack_fffffffffffffc50;
  Engine *in_stack_fffffffffffffc60;
  Engine *this_02;
  SstStream in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffc88;
  Engine *in_stack_fffffffffffffc90;
  BufferSTL *in_stack_fffffffffffffc98;
  undefined4 uVar8;
  BP3Deserializer *in_stack_fffffffffffffca0;
  allocator *paVar9;
  string *in_stack_fffffffffffffcc0;
  string *hint;
  undefined8 in_stack_fffffffffffffcc8;
  SstStream Stream;
  undefined1 uVar10;
  IO *in_stack_fffffffffffffcd0;
  void *in_stack_fffffffffffffcf8;
  string *in_stack_fffffffffffffd60;
  BufferSTL *in_stack_fffffffffffffd70;
  allocator local_261;
  string local_260 [39];
  allocator<char> local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [24];
  undefined8 in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe10;
  void *in_stack_fffffffffffffe18;
  BP5Deserializer *in_stack_fffffffffffffe20;
  undefined4 local_1b4;
  undefined4 local_184;
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [39];
  allocator local_59;
  string local_58 [36];
  SstStatusValue local_34;
  uint local_14;
  StepStatus local_4;
  
  uVar10 = (undefined1)((ulong)in_stack_fffffffffffffcc8 >> 0x38);
  iVar3 = (int)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  local_14 = in_ESI;
  if ((BeginStep(adios2::StepMode,float)::__var293 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&BeginStep(adios2::StepMode,float)::__var293), iVar2 != 0)) {
    in_stack_fffffffffffffd60 =
         (string *)
         ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/engine/sst/SstReader.cpp"
                             ,
                             "virtual StepStatus adios2::core::engine::SstReader::BeginStep(StepMode, const float)"
                             ,0x125);
    BeginStep::__var293 = (void *)ps_timer_create_(in_stack_fffffffffffffd60);
    __cxa_guard_release(&BeginStep(adios2::StepMode,float)::__var293);
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  if ((*(byte *)(in_RDI + 0x84) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,"Engine",&local_59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"SstReader",&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"BeginStep",&local_a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_d0,"BeginStep() is called a second time without an intervening EndStep()",
               &local_d1);
    helper::Throw<std::logic_error>
              ((string *)in_stack_fffffffffffffca0,(string *)in_stack_fffffffffffffc98,
               (string *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,iVar3);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  if (local_14 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"Engine",&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"SstReader",&local_121);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"BeginStep",&local_149);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_170,"SstReader::BeginStep inappropriate StepMode specified",&local_171);
    helper::Throw<std::invalid_argument>
              ((string *)in_stack_fffffffffffffca0,(string *)in_stack_fffffffffffffc98,
               (string *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,iVar3);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  Engine::RemoveCreatedVars(in_stack_fffffffffffffc60);
  local_34 = SstAdvanceStep((SstStream)in_stack_fffffffffffffc50,
                            (float)((ulong)in_stack_fffffffffffffc48 >> 0x20));
  if (local_34 == SstEndOfStream) {
    local_4 = EndOfStream;
  }
  else if (local_34 == SstTimeout) {
    local_4 = NotReady;
  }
  else if (local_34 == SstSuccess) {
    *(undefined1 *)(in_RDI + 0x84) = 1;
    if (*(int *)(in_RDI + 200) == 2) {
      this_00 = (BP5Deserializer *)SstGetCurMetadata(*(SstStream *)(in_RDI + 0xc0));
      uVar8 = (undefined4)((ulong)in_stack_fffffffffffffc98 >> 0x20);
      *(BP5Deserializer **)(in_RDI + 0xd8) = this_00;
      if (*(long *)(in_RDI + 0xe8) == 0) {
        in_stack_fffffffffffffcf8 = operator_new(0x418);
        adios2::format::BP5Deserializer::BP5Deserializer
                  ((BP5Deserializer *)in_stack_fffffffffffffca0,SUB41((uint)uVar8 >> 0x18,0),
                   SUB41((uint)uVar8 >> 0x10,0),SUB41((uint)uVar8 >> 8,0),SUB41(uVar8,0));
        *(void **)(in_RDI + 0xe8) = in_stack_fffffffffffffcf8;
        *(size_t *)(*(long *)(in_RDI + 0xe8) + 0x10) = in_RDI;
      }
      WriterCount = SstCurrentStep(*(SstStream *)(in_RDI + 0xc0));
      __ptr = SstGetNewMetaMetaData(in_stack_fffffffffffffc68,(size_t)in_stack_fffffffffffffc60);
      local_184 = 0;
      while( true ) {
        bVar7 = false;
        if (__ptr != (SstMetaMetaList)0x0) {
          bVar7 = __ptr[(int)local_184].BlockData != (char *)0x0;
        }
        if (!bVar7) break;
        adios2::format::BP5Deserializer::InstallMetaMetaData
                  ((BP5Deserializer *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        local_184 = local_184 + 1;
      }
      free(__ptr);
      Stream = *(SstStream *)(in_RDI + 0xc0);
      this_01 = (IO *)SstCurrentStep(Stream);
      psVar4 = (string *)
               SstGetAttributeData(in_stack_fffffffffffffc40,(size_t)in_stack_fffffffffffffc38);
      local_184 = 0;
      hint = psVar4;
      while( true ) {
        bVar7 = false;
        if (psVar4 != (string *)0x0) {
          bVar7 = (char *)(&psVar4->_M_string_length)[(long)(int)local_184 * 2] != (char *)0x0;
        }
        if (!bVar7) break;
        IO::RemoveAllAttributes((IO *)in_stack_fffffffffffffc50);
        adios2::format::BP5Deserializer::InstallAttributeData
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                   in_stack_fffffffffffffe08);
        local_184 = local_184 + 1;
      }
      Engine::RemoveCreatedVars(in_stack_fffffffffffffc60);
      SstCurrentStep(*(SstStream *)(in_RDI + 0xc0));
      adios2::format::BP5Deserializer::SetupForStep
                (this_00,(size_t)in_stack_fffffffffffffcf8,WriterCount);
      for (local_1b4 = 0; uVar10 = (undefined1)((ulong)Stream >> 0x38),
          (int)local_1b4 < **(int **)(in_RDI + 0xd8); local_1b4 = local_1b4 + 1) {
        adios2::format::BP5Deserializer::InstallMetaData
                  (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                   unaff_retaddr);
      }
      paVar9 = (allocator *)&stack0xfffffffffffffe1f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffe20,"in call to SST Reader BeginStep",paVar9);
      IO::ResetVariablesStepSelection(this_01,(bool)uVar10,hint);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe20);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe1f);
    }
    else if (*(int *)(in_RDI + 200) == 1) {
      if ((BeginStep(adios2::StepMode,float)::__var379 == '\0') &&
         (iVar3 = __cxa_guard_acquire(&BeginStep(adios2::StepMode,float)::__var379), iVar3 != 0)) {
        BeginStep::__var379 =
             (void *)ps_timer_create_("BP Marshaling Case - deserialize and install metadata");
        in_stack_fffffffffffffc90 = (Engine *)BeginStep::__var379;
        __cxa_guard_release(&BeginStep(adios2::StepMode,float)::__var379);
      }
      external::perfstubs_profiler::ScopedTimer::ScopedTimer
                ((ScopedTimer *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
      p_Var5 = SstGetCurMetadata(*(SstStream *)(in_RDI + 0xc0));
      *(SstFullMetadata *)(in_RDI + 0xd8) = p_Var5;
      pvVar6 = operator_new(0x490);
      adios2::format::BP3Deserializer::BP3Deserializer
                (in_stack_fffffffffffffc50,(Comm *)in_stack_fffffffffffffc48);
      *(void **)(in_RDI + 0xe0) = pvVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"in call to BP3::Open for reading",&local_211);
      this_02 = (Engine *)&local_239;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_238,"sst",(allocator *)this_02);
      adios2::format::BPBase::Init
                (in_stack_000009d0,in_stack_000009c8,in_stack_000009c0,in_stack_000009b8);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator(&local_239);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_260,"in SST Streaming Listener",&local_261);
      adios2::format::BufferSTL::Resize(in_stack_fffffffffffffd70,in_RDI,in_stack_fffffffffffffd60);
      std::__cxx11::string::~string(local_260);
      std::allocator<char>::~allocator((allocator<char> *)&local_261);
      __dest = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0xe6fa07);
      psVar1 = (size_t *)**(long **)(*(long *)(in_RDI + 0xd8) + 8);
      memcpy(__dest,(void *)psVar1[1],*psVar1);
      Engine::RemoveCreatedVars(this_02);
      adios2::format::BP3Deserializer::ParseMetadata
                (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
      in_stack_fffffffffffffc40 = (SstStream)&stack0xfffffffffffffd77;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffd78,"in call to SST Reader BeginStep",
                 (allocator *)in_stack_fffffffffffffc40);
      IO::ResetVariablesStepSelection
                (in_stack_fffffffffffffcd0,(bool)uVar10,in_stack_fffffffffffffcc0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd78);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd77);
      external::perfstubs_profiler::ScopedTimer::~ScopedTimer
                ((ScopedTimer *)in_stack_fffffffffffffc40);
    }
    local_4 = OK;
  }
  else {
    local_4 = OtherError;
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_fffffffffffffc40);
  return local_4;
}

Assistant:

StepStatus SstReader::BeginStep(StepMode Mode, const float timeout_sec)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    SstStatusValue result;
    if (m_BetweenStepPairs)
    {
        helper::Throw<std::logic_error>("Engine", "SstReader", "BeginStep",
                                        "BeginStep() is called a second time "
                                        "without an intervening EndStep()");
    }

    switch (Mode)
    {
    case adios2::StepMode::Append:
    case adios2::StepMode::Update:
        helper::Throw<std::invalid_argument>(
            "Engine", "SstReader", "BeginStep",
            "SstReader::BeginStep inappropriate StepMode specified");
    case adios2::StepMode::Read:
        break;
    }
    RemoveCreatedVars();
    result = SstAdvanceStep(m_Input, timeout_sec);
    if (result == SstEndOfStream)
    {
        return StepStatus::EndOfStream;
    }
    if (result == SstTimeout)
    {
        return StepStatus::NotReady;
    }

    if (result != SstSuccess)
    {
        return StepStatus::OtherError;
    }

    m_BetweenStepPairs = true;

    if (m_WriterMarshalMethod == SstMarshalBP5)
    {
        m_CurrentStepMetaData = SstGetCurMetadata(m_Input);
        if (!m_BP5Deserializer)
        {
            m_BP5Deserializer = new format::BP5Deserializer(m_WriterIsRowMajor, Params.IsRowMajor);
            m_BP5Deserializer->m_Engine = this;
        }
        SstMetaMetaList MMList = SstGetNewMetaMetaData(m_Input, SstCurrentStep(m_Input));
        //      m_BP5Deserializer->StepInit(m_IO.m_Parameters,
        //                                "in call to BP5::BeginStep", "bp5");
        int i = 0;
        while (MMList && MMList[i].BlockData)
        {
            format::BP5Base::MetaMetaInfoBlock MM;
            MM.MetaMetaID = MMList[i].ID;
            MM.MetaMetaIDLen = MMList[i].IDSize;
            MM.MetaMetaInfo = MMList[i].BlockData;
            MM.MetaMetaInfoLen = MMList[i].BlockSize;
            m_BP5Deserializer->InstallMetaMetaData(MM);
            i++;
        }
        free(MMList);

        SstBlock AttributeBlockList = SstGetAttributeData(m_Input, SstCurrentStep(m_Input));
        i = 0;
        while (AttributeBlockList && AttributeBlockList[i].BlockData)
        {
            m_IO.RemoveAllAttributes();
            m_BP5Deserializer->InstallAttributeData(AttributeBlockList[i].BlockData,
                                                    AttributeBlockList[i].BlockSize);
            i++;
        }

        RemoveCreatedVars();
        m_BP5Deserializer->SetupForStep(
            SstCurrentStep(m_Input), static_cast<size_t>(m_CurrentStepMetaData->WriterCohortSize));

        for (int i = 0; i < m_CurrentStepMetaData->WriterCohortSize; i++)
        {
            struct _SstData *tmp = m_CurrentStepMetaData->WriterMetadata[i];
            m_BP5Deserializer->InstallMetaData(tmp->block, tmp->DataSize, i);
        }

        m_IO.ResetVariablesStepSelection(true, "in call to SST Reader BeginStep");
    }
    else if (m_WriterMarshalMethod == SstMarshalBP)
    {
        PERFSTUBS_SCOPED_TIMER("BP Marshaling Case - deserialize and install metadata");
        m_CurrentStepMetaData = SstGetCurMetadata(m_Input);
        // At begin step, you get metadata from the writers.  You need to
        // use this for two things: First, you need to create the
        // appropriate variables on the reader side to represent what has
        // been written.  Second, you must keep the metadata around (or a
        // summary structure that represents its contents), so that you can
        // look at it in DoGets* and issue the appropriate
        // ReadRemoteMemory() requests to the writers.  This is because the
        // full data isn't here yet.  We don't know what we'll need on this
        // reader, and we don't want to send *all* data from *all* writers
        // here because that's not scalable.  So, we'll fetch what we need.
        // This is one of the core ideas of SST.

        //   Further clarification:
        //   m_CurrentStepMetaData is a struct like this:

        //     struct _SstFullMetadata
        //     {
        //       int WriterCohortSize;
        //       struct _SstData **WriterMetadata;
        //       void **DP_TimestepInfo;
        //     };

        //   WriterMetadata has an element for each Writer rank
        //   (WriterCohortSize).  WriterMetadata[i] is a pointer to (a copy
        //   of) the SstData block of Metadata that was passed to
        //   SstProvideTimestep by Writer rank i.  SST has simply gathered
        //   them and provided them to each reader.  The DP_TimestepInfo is
        //   for the DataPlane, and DP_TimestepInfo[i] should be passed as
        //   the DP_TimestepInfo parameter when a SstReadRemoteMemory call
        //   is made requesting rank i.  (This may contain MR keys, or
        //   anything else that the Data Plane needs for efficient RDMA on
        //   whatever transport it is using.  But it is opaque to the Engine
        //   (and to the control plane).)

        m_BP3Deserializer = new format::BP3Deserializer(m_Comm);
        m_BP3Deserializer->Init(m_IO.m_Parameters, "in call to BP3::Open for reading", "sst");

        m_BP3Deserializer->m_Metadata.Resize((*m_CurrentStepMetaData->WriterMetadata)->DataSize,
                                             "in SST Streaming Listener");

        std::memcpy(m_BP3Deserializer->m_Metadata.m_Buffer.data(),
                    (*m_CurrentStepMetaData->WriterMetadata)->block,
                    (*m_CurrentStepMetaData->WriterMetadata)->DataSize);

        RemoveCreatedVars();
        m_BP3Deserializer->ParseMetadata(m_BP3Deserializer->m_Metadata, *this);
        m_IO.ResetVariablesStepSelection(true, "in call to SST Reader BeginStep");
    }
    else if (m_WriterMarshalMethod == SstMarshalFFS)
    {
        // For FFS-based marshaling, SstAdvanceStep takes care of installing
        // the metadata, creating variables using the varFFScallback and
        // arrayFFScallback, so there's nothing to be done now.  This
        // comment is just for clarification.
    }
    else
    {
        // unknown marshaling method, shouldn't happen
    }

    return StepStatus::OK;
}